

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

int __thiscall cmCTest::ProcessSteps(cmCTest *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  unsigned_long uVar7;
  long *plVar8;
  ostream *poVar9;
  uint uVar10;
  long lVar11;
  size_type *psVar12;
  cmCTestGenericHandler *this_00;
  ulong dindex;
  bool bVar13;
  cmDuration cVar14;
  string fullname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  Directory d;
  string notes_dir;
  string local_1f0;
  string local_1d0;
  Directory local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  lVar11 = 0;
  do {
    bVar3 = (&((this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->Parts[0].Enabled)
            [lVar11];
    if (bVar3 != false) break;
    bVar13 = lVar11 != 0x2c0;
    lVar11 = lVar11 + 0x40;
  } while (bVar13);
  _Var2._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  uVar6 = 0;
  bVar13 = false;
  uVar10 = 0;
  if ((_Var2._M_head_impl)->Parts[1].Enabled != false) {
    cVar14 = cmCTestScriptHandler::GetRemainingTimeAllowed(&(_Var2._M_head_impl)->ScriptHandler);
    bVar13 = false;
    uVar10 = 0;
    if (120.0 < cVar14.__r) {
      this_00 = &(((this->Impl)._M_t.
                   super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                   .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->UpdateHandler).
                 super_cmCTestGenericHandler;
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"SourceDirectory","");
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"SourceDirectory","");
      GetCTestConfiguration(&local_1f0,this,&local_1d0);
      cmCTestGenericHandler::SetPersistentOption
                (this_00,(string *)local_1a8,local_1f0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      uVar4 = (*this_00->_vptr_cmCTestGenericHandler[1])(this_00);
      uVar10 = uVar4 >> 0x1f;
      bVar13 = uVar4 != 0;
    }
  }
  _Var2._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  if ((bVar13) || ((_Var2._M_head_impl)->TestModel != 2)) {
    if (((_Var2._M_head_impl)->Parts[2].Enabled == true) &&
       (cVar14 = cmCTestScriptHandler::GetRemainingTimeAllowed(&(_Var2._M_head_impl)->ScriptHandler)
       , 120.0 < cVar14.__r)) {
      _Var2._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      iVar5 = (**(code **)(*(long *)&((_Var2._M_head_impl)->ConfigureHandler).
                                     super_cmCTestGenericHandler + 8))
                        (&(_Var2._M_head_impl)->ConfigureHandler);
      uVar10 = uVar10 + (iVar5 >> 0x1f) * -2;
    }
    _Var2._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    if (((_Var2._M_head_impl)->Parts[3].Enabled == true) &&
       (cVar14 = cmCTestScriptHandler::GetRemainingTimeAllowed(&(_Var2._M_head_impl)->ScriptHandler)
       , 120.0 < cVar14.__r)) {
      UpdateCTestConfiguration(this);
      _Var2._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      iVar5 = (**(code **)(*(long *)&((_Var2._M_head_impl)->BuildHandler).
                                     super_cmCTestGenericHandler + 8))
                        (&(_Var2._M_head_impl)->BuildHandler);
      uVar10 = uVar10 + (iVar5 >> 0x1f) * -4;
    }
    _Var2._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    if (((byte)(bVar3 ^ 1U | (_Var2._M_head_impl)->Parts[4].Enabled) == 1) &&
       (cVar14 = cmCTestScriptHandler::GetRemainingTimeAllowed(&(_Var2._M_head_impl)->ScriptHandler)
       , 120.0 < cVar14.__r)) {
      UpdateCTestConfiguration(this);
      _Var2._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      iVar5 = (**(code **)(*(long *)&((_Var2._M_head_impl)->TestHandler).super_cmCTestGenericHandler
                          + 8))(&(_Var2._M_head_impl)->TestHandler);
      uVar10 = uVar10 + (iVar5 >> 0x1f) * -8;
    }
    _Var2._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    if (((_Var2._M_head_impl)->Parts[5].Enabled == true) &&
       (cVar14 = cmCTestScriptHandler::GetRemainingTimeAllowed(&(_Var2._M_head_impl)->ScriptHandler)
       , 120.0 < cVar14.__r)) {
      UpdateCTestConfiguration(this);
      _Var2._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      uVar6 = (**(code **)(*(long *)&((_Var2._M_head_impl)->CoverageHandler).
                                     super_cmCTestGenericHandler + 8))
                        (&(_Var2._M_head_impl)->CoverageHandler);
      uVar10 = (uVar6 >> 0x1a & 0xffffffe0) + uVar10;
    }
    _Var2._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    uVar6 = uVar10;
    if (((_Var2._M_head_impl)->Parts[6].Enabled == true) &&
       (cVar14 = cmCTestScriptHandler::GetRemainingTimeAllowed(&(_Var2._M_head_impl)->ScriptHandler)
       , 120.0 < cVar14.__r)) {
      UpdateCTestConfiguration(this);
      _Var2._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      uVar6 = (**(code **)(*(long *)&((_Var2._M_head_impl)->MemCheckHandler).
                                     super_cmCTestTestHandler + 8))
                        (&(_Var2._M_head_impl)->MemCheckHandler);
      uVar6 = uVar6 >> 0x1b & 0xfffffff0 | uVar10;
    }
    if (bVar3 != false) {
      _Var2._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      local_1a8._0_8_ = local_1a8 + 0x10;
      lVar11 = *(long *)&((_Var2._M_head_impl)->BinaryDir)._M_dataplus;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,lVar11,
                 ((_Var2._M_head_impl)->BinaryDir)._M_string_length + lVar11);
      std::__cxx11::string::append((char *)local_1a8);
      bVar3 = cmsys::SystemTools::FileIsDirectory((string *)local_1a8);
      if (bVar3) {
        cmsys::Directory::Directory(&local_1b0);
        cmsys::Directory::Load(&local_1b0,(string *)local_1a8,(string *)0x0);
        for (dindex = 0; uVar7 = cmsys::Directory::GetNumberOfFiles(&local_1b0), dindex < uVar7;
            dindex = dindex + 1) {
          cmsys::Directory::GetFile(&local_1b0,dindex);
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1d0,local_1a8._0_8_,
                     (pointer)(local_1a8._0_8_ + local_1a8._8_8_));
          std::__cxx11::string::append((char *)&local_1d0);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_1d0);
          psVar12 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_1f0.field_2._M_allocated_capacity = *psVar12;
            local_1f0.field_2._8_8_ = plVar8[3];
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          }
          else {
            local_1f0.field_2._M_allocated_capacity = *psVar12;
            local_1f0._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_1f0._M_string_length = plVar8[1];
          *plVar8 = (long)psVar12;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          bVar3 = cmsys::SystemTools::FileExists(&local_1f0);
          if ((bVar3) && (bVar3 = cmsys::SystemTools::FileIsDirectory(&local_1f0), !bVar3)) {
            _Var2._M_head_impl =
                 (this->Impl)._M_t.
                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
                 super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
            if (((_Var2._M_head_impl)->NotesFiles)._M_string_length != 0) {
              std::__cxx11::string::append((char *)&(_Var2._M_head_impl)->NotesFiles);
            }
            std::__cxx11::string::_M_append
                      ((char *)&((this->Impl)._M_t.
                                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                 .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                                NotesFiles,(ulong)local_1f0._M_dataplus._M_p);
            ((this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->Parts[8].Enabled = true
            ;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
        }
        cmsys::Directory::~Directory(&local_1b0);
      }
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
    if (((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->Parts[8].Enabled == true) {
      UpdateCTestConfiguration(this);
      _Var2._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      if (((_Var2._M_head_impl)->NotesFiles)._M_string_length != 0) {
        GenerateNotesFile(this,&(_Var2._M_head_impl)->NotesFiles);
      }
    }
    if (((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->Parts[7].Enabled == true) {
      UpdateCTestConfiguration(this);
      _Var2._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      uVar10 = (**(code **)(*(long *)&((_Var2._M_head_impl)->SubmitHandler).
                                      super_cmCTestGenericHandler + 8))
                         (&(_Var2._M_head_impl)->SubmitHandler);
      uVar6 = (uVar10 >> 0x19 & 0xffffffc0) + uVar6;
    }
    if (uVar6 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Errors while running CTest",0x1a);
      std::ios::widen((char)(ostringstream *)local_1a8 +
                      (char)*(undefined8 *)(local_1a8._0_8_ + -0x18));
      std::ostream::put((char)local_1a8);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(this,7,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0x3ff,local_1f0._M_dataplus._M_p,false);
      paVar1 = &local_1f0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      _Var2._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      if ((_Var2._M_head_impl)->OutputTestOutputOnTestFailure == false) {
        lVar11 = *(long *)&((_Var2._M_head_impl)->BinaryDir)._M_dataplus;
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,lVar11,
                   ((_Var2._M_head_impl)->BinaryDir)._M_string_length + lVar11);
        plVar8 = (long *)std::__cxx11::string::append((char *)local_1a8);
        psVar12 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_1f0.field_2._M_allocated_capacity = *psVar12;
          local_1f0.field_2._8_8_ = plVar8[3];
          local_1f0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_1f0.field_2._M_allocated_capacity = *psVar12;
          local_1f0._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_1f0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Output from these tests are in: ",0x20);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_1f0._M_dataplus._M_p,
                            local_1f0._M_string_length);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0x405,local_1d0._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "Use \"--rerun-failed --output-on-failure\" to re-run the failed cases verbosely."
                   ,0x4e);
        std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_1a8);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0x409,local_1d0._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != paVar1) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return uVar6;
}

Assistant:

int cmCTest::ProcessSteps()
{
  int res = 0;
  bool notest = true;
  int update_count = 0;

  for (Part p = PartStart; notest && p != PartCount;
       p = static_cast<Part>(p + 1)) {
    notest = !this->Impl->Parts[p];
  }
  if (this->Impl->Parts[PartUpdate] &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    cmCTestUpdateHandler* uphandler = this->GetUpdateHandler();
    uphandler->SetPersistentOption(
      "SourceDirectory",
      this->GetCTestConfiguration("SourceDirectory").c_str());
    update_count = uphandler->ProcessHandler();
    if (update_count < 0) {
      res |= cmCTest::UPDATE_ERRORS;
    }
  }
  if (this->Impl->TestModel == cmCTest::CONTINUOUS && !update_count) {
    return 0;
  }
  if (this->Impl->Parts[PartConfigure] &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    if (this->GetConfigureHandler()->ProcessHandler() < 0) {
      res |= cmCTest::CONFIGURE_ERRORS;
    }
  }
  if (this->Impl->Parts[PartBuild] &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    this->UpdateCTestConfiguration();
    if (this->GetBuildHandler()->ProcessHandler() < 0) {
      res |= cmCTest::BUILD_ERRORS;
    }
  }
  if ((this->Impl->Parts[PartTest] || notest) &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    this->UpdateCTestConfiguration();
    if (this->GetTestHandler()->ProcessHandler() < 0) {
      res |= cmCTest::TEST_ERRORS;
    }
  }
  if (this->Impl->Parts[PartCoverage] &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    this->UpdateCTestConfiguration();
    if (this->GetCoverageHandler()->ProcessHandler() < 0) {
      res |= cmCTest::COVERAGE_ERRORS;
    }
  }
  if (this->Impl->Parts[PartMemCheck] &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    this->UpdateCTestConfiguration();
    if (this->GetMemCheckHandler()->ProcessHandler() < 0) {
      res |= cmCTest::MEMORY_ERRORS;
    }
  }
  if (!notest) {
    std::string notes_dir = this->Impl->BinaryDir + "/Testing/Notes";
    if (cmSystemTools::FileIsDirectory(notes_dir)) {
      cmsys::Directory d;
      d.Load(notes_dir);
      unsigned long kk;
      for (kk = 0; kk < d.GetNumberOfFiles(); kk++) {
        const char* file = d.GetFile(kk);
        std::string fullname = notes_dir + "/" + file;
        if (cmSystemTools::FileExists(fullname) &&
            !cmSystemTools::FileIsDirectory(fullname)) {
          if (!this->Impl->NotesFiles.empty()) {
            this->Impl->NotesFiles += ";";
          }
          this->Impl->NotesFiles += fullname;
          this->Impl->Parts[PartNotes].Enable();
        }
      }
    }
  }
  if (this->Impl->Parts[PartNotes]) {
    this->UpdateCTestConfiguration();
    if (!this->Impl->NotesFiles.empty()) {
      this->GenerateNotesFile(this->Impl->NotesFiles);
    }
  }
  if (this->Impl->Parts[PartSubmit]) {
    this->UpdateCTestConfiguration();
    if (this->GetSubmitHandler()->ProcessHandler() < 0) {
      res |= cmCTest::SUBMIT_ERRORS;
    }
  }
  if (res != 0) {
    cmCTestLog(this, ERROR_MESSAGE, "Errors while running CTest" << std::endl);
    if (!this->Impl->OutputTestOutputOnTestFailure) {
      const std::string lastTestLog =
        this->GetBinaryDir() + "/Testing/Temporary/LastTest.log";
      cmCTestLog(this, ERROR_MESSAGE,
                 "Output from these tests are in: " << lastTestLog
                                                    << std::endl);
      cmCTestLog(this, ERROR_MESSAGE,
                 "Use \"--rerun-failed --output-on-failure\" to re-run the "
                 "failed cases verbosely."
                   << std::endl);
    }
  }
  return res;
}